

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O3

void oonf_subsystem_unconfigure(cfg_schema *schema,oonf_subsystem *subsystem)

{
  cfg_schema_section *section;
  
  if ((log_global_mask[5] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",0xc3,(void *)0x0,0,
             "Unregister subsystem %s",subsystem->name);
  }
  for (section = subsystem->cfg_section; section != (cfg_schema_section *)0x0;
      section = section->next_section) {
    if ((log_global_mask[5] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_SUBSYSTEMS,"src/libcore/oonf_subsystem.c",199,(void *)0x0,0,
               "(%s) Unregister configuration section %s",subsystem->name,section->type);
    }
    cfg_schema_remove_section(schema,section);
  }
  return;
}

Assistant:

void
oonf_subsystem_unconfigure(struct cfg_schema *schema, struct oonf_subsystem *subsystem) {
  struct cfg_schema_section *schema_section;

  OONF_INFO(LOG_SUBSYSTEMS, "Unregister subsystem %s", subsystem->name);

  schema_section = subsystem->cfg_section;
  while (schema_section) {
    OONF_DEBUG(LOG_SUBSYSTEMS, "(%s) Unregister configuration section %s", subsystem->name, schema_section->type);
    cfg_schema_remove_section(schema, schema_section);
    schema_section = schema_section->next_section;
  }
}